

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayFill(PrintExpressionContents *this,ArrayFill *curr)

{
  ostream *o;
  HeapType type;
  string_view local_28;
  ArrayFill *local_18;
  ArrayFill *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (ArrayFill *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"array.fill ");
  printMedium(o,local_28);
  type = wasm::Type::getHeapType(&local_18->ref->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    printMedium(o, "array.fill ");
    printHeapTypeName(curr->ref->type.getHeapType());
  }